

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O1

void __thiscall classSHA256::finalize(classSHA256 *this,void *hash,size_t len)

{
  uint32_t *__src;
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t __n;
  void *__s;
  
  __src = (this->state).w;
  uVar5 = (ulong)(this->state).chunkSize;
  *(undefined1 *)((long)(this->state).w + uVar5) = 0x80;
  uVar3 = (ulong)(this->state).chunkSize;
  __s = (void *)((long)(this->state).w + uVar3 + 1);
  if (uVar5 < 0x38) {
    memset(__s,0,0x37 - uVar3);
  }
  else {
    memset(__s,0,0x3f - uVar3);
    processChunk(this);
    (this->state).w[8] = 0;
    (this->state).w[9] = 0;
    (this->state).w[10] = 0;
    (this->state).w[0xb] = 0;
    (this->state).w[4] = 0;
    (this->state).w[5] = 0;
    (this->state).w[6] = 0;
    (this->state).w[7] = 0;
    __src[0] = 0;
    __src[1] = 0;
    (this->state).w[2] = 0;
    (this->state).w[3] = 0;
    (this->state).w[0xc] = 0;
    (this->state).w[0xd] = 0;
  }
  uVar1 = (this->state).length;
  uVar2 = (uint)(uVar1 >> 0x20);
  (this->state).w[0xe] =
       uVar2 << 0x18 | (uint)(byte)(uVar1 >> 0x38) | uVar2 >> 8 & 0xff00 | (uVar2 & 0xff00) << 8;
  uVar2 = (uint)uVar1;
  (this->state).w[0xf] =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  processChunk(this);
  lVar4 = -8;
  do {
    uVar2 = __src[lVar4];
    (this->state).w[lVar4 + 8] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  __n = 0x20;
  if (len < 0x20) {
    __n = len;
  }
  memcpy(hash,__src,__n);
  return;
}

Assistant:

void classSHA256::finalize(void *hash, size_t len)
{
    // Pad the last chunk.  We may need two padding chunks if there
    // isn't enough room in the first for the padding and length.
    uint8_t *wbytes = (uint8_t *)state.w;
    if (state.chunkSize <= (64 - 9)) {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - 8 - (state.chunkSize + 1));
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    } else {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - (state.chunkSize + 1));
        processChunk();
        memset(wbytes, 0x00, 64 - 8);
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    }

    // Convert the result into big endian and return it.
    for (uint8_t posn = 0; posn < 8; ++posn)
        state.w[posn] = htobe32(state.h[posn]);

    // Copy the hash to the caller's return buffer.
    if (len > 32)
        len = 32;
    memcpy(hash, state.w, len);
}